

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mocker::SyntaxError::~SyntaxError(SyntaxError *this)

{
  SyntaxError *this_local;
  
  ~SyntaxError(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

SyntaxError(const Position &beg, const Position &end)
      : CompileError(beg, end) {}